

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O3

int testNonUpdatablePipelineWithOneUpdatableModel(void)

{
  bool bVar1;
  Pipeline *pPVar2;
  Type *m;
  Type *m_00;
  Type *m_01;
  Type *m_02;
  ostream *poVar3;
  int iVar4;
  RepeatedPtrField<CoreML::Specification::Model> *this;
  Result res;
  TensorAttributes tensorAttributesD;
  TensorAttributes tensorAttributesC;
  TensorAttributes tensorAttributesB;
  TensorAttributes tensorAttributesA;
  Model spec;
  undefined1 local_e8 [8];
  _Alloc_hider local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  TensorAttributes local_98;
  TensorAttributes local_88;
  TensorAttributes local_78;
  TensorAttributes local_68;
  Model local_58;
  
  CoreML::Specification::Model::Model(&local_58);
  CoreML::Result::Result((Result *)local_c0);
  local_68.name = "A";
  local_68.dimension = 3;
  local_68._12_4_ = 0;
  local_78.name = "B";
  local_78.dimension = 1;
  local_78._12_4_ = 0;
  local_88.name = "C";
  local_88.dimension = 1;
  local_88._12_4_ = 0;
  local_98.name = "D";
  local_98.dimension = 3;
  local_98._12_4_ = 0;
  pPVar2 = buildEmptyPipelineModelWithStringOutput(&local_58,false,&local_68,"E");
  this = &pPVar2->models_;
  m = google::protobuf::internal::RepeatedPtrFieldBase::
      Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                (&this->super_RepeatedPtrFieldBase,(Type *)0x0);
  m_00 = google::protobuf::internal::RepeatedPtrFieldBase::
         Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                   (&this->super_RepeatedPtrFieldBase,(Type *)0x0);
  m_01 = google::protobuf::internal::RepeatedPtrFieldBase::
         Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                   (&this->super_RepeatedPtrFieldBase,(Type *)0x0);
  m_02 = google::protobuf::internal::RepeatedPtrFieldBase::
         Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                   (&this->super_RepeatedPtrFieldBase,(Type *)0x0);
  buildBasicNeuralNetworkModel(m,false,&local_68,&local_78,1,false,false);
  buildBasicNeuralNetworkModel(m_00,false,&local_78,&local_88,1,false,false);
  buildBasicNeuralNetworkModel(m_01,false,&local_88,&local_98,1,false,false);
  buildBasicNearestNeighborClassifier(m_02,true,&local_98,"E");
  CoreML::Model::validate((Result *)local_e8,m);
  local_c0 = local_e8;
  std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_p != &local_d0) {
    operator_delete(local_e0._M_p,local_d0._M_allocated_capacity + 1);
  }
  bVar1 = CoreML::Result::good((Result *)local_c0);
  if (bVar1) {
    CoreML::Model::validate((Result *)local_e8,m_00);
    local_c0 = local_e8;
    std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_p != &local_d0) {
      operator_delete(local_e0._M_p,local_d0._M_allocated_capacity + 1);
    }
    bVar1 = CoreML::Result::good((Result *)local_c0);
    if (bVar1) {
      CoreML::Model::validate((Result *)local_e8,m_01);
      local_c0 = local_e8;
      std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_p != &local_d0) {
        operator_delete(local_e0._M_p,local_d0._M_allocated_capacity + 1);
      }
      bVar1 = CoreML::Result::good((Result *)local_c0);
      if (bVar1) {
        CoreML::Model::validate((Result *)local_e8,m_02);
        local_c0 = local_e8;
        std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_p != &local_d0) {
          operator_delete(local_e0._M_p,local_d0._M_allocated_capacity + 1);
        }
        bVar1 = CoreML::Result::good((Result *)local_c0);
        if (bVar1) {
          CoreML::Model::validate((Result *)local_e8,&local_58);
          local_c0 = local_e8;
          std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_p != &local_d0) {
            operator_delete(local_e0._M_p,local_d0._M_allocated_capacity + 1);
          }
          bVar1 = CoreML::Result::good((Result *)local_c0);
          iVar4 = 0;
          if (!bVar1) goto LAB_001a818d;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                     ,0x7c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x464);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"!((res).good())",0xf);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                     ,0x7c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x460);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(res).good()",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                   ,0x7c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x45d);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(res).good()",0xc);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                 ,0x7c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x45a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(res).good()",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x7c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x457);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  }
  std::ostream::put((char)poVar3);
  iVar4 = 1;
  std::ostream::flush();
LAB_001a818d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_p != &local_a8) {
    operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_58);
  return iVar4;
}

Assistant:

int testNonUpdatablePipelineWithOneUpdatableModel() {

    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesA = { "A", 3 };
    TensorAttributes tensorAttributesB = { "B", 1 };
    TensorAttributes tensorAttributesC = { "C", 1 };
    TensorAttributes tensorAttributesD = { "D", 3 };

    auto pipeline = buildEmptyPipelineModelWithStringOutput(spec, false, &tensorAttributesA, "E");

    auto m1 = pipeline->add_models();
    auto m2 = pipeline->add_models();
    auto m3 = pipeline->add_models();
    auto m4 = pipeline->add_models();

    (void)buildBasicNeuralNetworkModel(*m1, false, &tensorAttributesA, &tensorAttributesB);
    (void)buildBasicNeuralNetworkModel(*m2, false, &tensorAttributesB, &tensorAttributesC);
    (void)buildBasicNeuralNetworkModel(*m3, false, &tensorAttributesC, &tensorAttributesD);
    (void)buildBasicNearestNeighborClassifier(*m4, true, &tensorAttributesD, "E");

    res = Model::validate(*m1);
    ML_ASSERT_GOOD(res);

    res = Model::validate(*m2);
    ML_ASSERT_GOOD(res);

    res = Model::validate(*m3);
    ML_ASSERT_GOOD(res);

    res = Model::validate(*m4);
    ML_ASSERT_GOOD(res);

    // expect validation to fail due to presence of uptable model in non-updatable pipeline.
    res = Model::validate(spec);
    ML_ASSERT_BAD(res);

    return 0;
}